

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

AltNode * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::AppendSurrogateRangeToDisjunction
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,codepoint_t minorCodePoint,
          codepoint_t majorCodePoint,AltNode *lastAltNode)

{
  uint uVar1;
  code *pcVar2;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPVar3;
  bool bVar4;
  undefined4 *puVar5;
  MatchCharNode *this_00;
  MatchSetNode *pMVar6;
  ConcatNode *pCVar7;
  ConcatNode *pCVar8;
  AltNode *pAVar9;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPVar10;
  AltNode *pAVar11;
  uint uVar12;
  codepoint_t cVar13;
  uint uVar14;
  codepoint_t cVar15;
  int iVar16;
  Char local_7a;
  MatchSetNode *pMStack_78;
  char16 lowerMajorBoundary;
  MatchSetNode *local_70;
  AltNode *local_68;
  char16 local_5a;
  codepoint_t cStack_58;
  undefined4 uStack_54;
  char16 ignore;
  MatchSetNode *local_50;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *local_48;
  Char local_3a;
  char16 local_38;
  char16 local_36;
  Char local_34;
  char16 lowerMinorBoundary;
  char16 upperMinorCodeUnit;
  char16 lowerMajorCodeUnit;
  char16 upperMajorCodeUnit;
  char16 lowerMinorCodeUnit;
  
  local_68 = (AltNode *)CONCAT44(local_68._4_4_,majorCodePoint - minorCodePoint);
  if (majorCodePoint < minorCodePoint || majorCodePoint - minorCodePoint == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x194,"(minorCodePoint < majorCodePoint)","minorCodePoint < majorCodePoint")
    ;
    if (!bVar4) goto LAB_00d23193;
    *puVar5 = 0;
  }
  if (minorCodePoint < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x195,"(minorCodePoint >= 0x10000u)","minorCodePoint >= 0x10000u");
    if (!bVar4) goto LAB_00d23193;
    *puVar5 = 0;
  }
  if (majorCodePoint < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x196,"(majorCodePoint >= 0x10000u)","majorCodePoint >= 0x10000u");
    if (!bVar4) goto LAB_00d23193;
    *puVar5 = 0;
  }
  local_70 = (MatchSetNode *)CONCAT44(local_70._4_4_,minorCodePoint);
  if ((((this->scriptContext->config).threadConfig)->m_ES6Unicode != true) ||
     (this->unicodeFlagPresent == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x197,
                       "(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent)"
                       ,
                       "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent"
                      );
    if (!bVar4) goto LAB_00d23193;
    *puVar5 = 0;
  }
  cVar13 = (codepoint_t)local_70;
  Js::NumberUtilities::CodePointAsSurrogatePair((codepoint_t)local_70,&lowerMinorBoundary,&local_38)
  ;
  local_50 = (MatchSetNode *)(ulong)majorCodePoint;
  Js::NumberUtilities::CodePointAsSurrogatePair(majorCodePoint,&local_36,&local_34);
  uVar1 = (cVar13 & 0xfffffc00) + 0x400;
  if (uVar1 < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x1a3,"(minorBoundary >= 0x10000)","minorBoundary >= 0x10000");
    if (!bVar4) goto LAB_00d23193;
    *puVar5 = 0;
  }
  if ((uint)local_50 < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x1a4,"(majorBoundary >= 0x10000)","majorBoundary >= 0x10000");
    if (!bVar4) goto LAB_00d23193;
    *puVar5 = 0;
  }
  uVar14 = (uint)local_50 & 0xfffffc00;
  if (uVar14 < uVar1) {
    if (0x3ff < (uint)local_68) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x1ae,"(majorCodePoint - minorCodePoint < 0x400u)",
                         "majorCodePoint - minorCodePoint < 0x400u");
      if (!bVar4) goto LAB_00d23193;
      *puVar5 = 0;
    }
    if (lowerMinorBoundary != local_36) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x1af,"(lowerMinorCodeUnit == lowerMajorCodeUnit)",
                         "lowerMinorCodeUnit == lowerMajorCodeUnit");
      if (!bVar4) goto LAB_00d23193;
      *puVar5 = 0;
    }
    this_00 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
    MatchCharNode::MatchCharNode(this_00,lowerMinorBoundary);
    pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar6,false,false);
    CharSet<char16_t>::SetRange(&pMVar6->set,this->ctAllocator,local_38,local_34);
    pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
    pCVar8 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
    ConcatNode::ConcatNode(pCVar8,(Node *)pMVar6,(ConcatNode *)0x0);
    ConcatNode::ConcatNode(pCVar7,(Node *)this_00,pCVar8);
    pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
    pAVar11 = (AltNode *)0x0;
  }
  else {
    if (uVar1 - (codepoint_t)local_70 == 1) {
      pMStack_78 = (MatchSetNode *)CreateSurrogatePairAtom(this,lowerMinorBoundary,local_38);
LAB_00d22be6:
      _cStack_58 = (MatchCharNode *)CONCAT44(uStack_54,uVar1);
    }
    else {
      if ((cVar13 & 0xfffffc00) != (codepoint_t)local_70) {
        if (0x3ff < uVar1 - (codepoint_t)local_70) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x1c5,"(minorBoundary - minorCodePoint < 0x400u)",
                             "minorBoundary - minorCodePoint < 0x400u");
          if (!bVar4) goto LAB_00d23193;
          *puVar5 = 0;
        }
        _cStack_58 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        MatchCharNode::MatchCharNode(_cStack_58,lowerMinorBoundary);
        pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
        pMStack_78 = pMVar6;
        MatchSetNode::MatchSetNode(pMVar6,false,true);
        CharSet<char16_t>::SetRange(&pMVar6->set,this->ctAllocator,local_38,L'\xdfff');
        pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        pCVar8 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        ConcatNode::ConcatNode(pCVar8,&pMStack_78->super_Node,(ConcatNode *)0x0);
        pMStack_78 = (MatchSetNode *)pCVar7;
        ConcatNode::ConcatNode(pCVar7,&_cStack_58->super_Node,pCVar8);
        goto LAB_00d22be6;
      }
      pMStack_78 = (MatchSetNode *)0x0;
      _cStack_58 = (MatchCharNode *)CONCAT44(uStack_54,(codepoint_t)local_70);
    }
    uVar12 = (uint)local_50;
    if (uVar14 == uVar12) {
      pPVar10 = (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)
                CreateSurrogatePairAtom(this,local_36,local_34);
      cVar13 = uVar12 - 0x400;
    }
    else if ((uVar12 & 0x3ff) == 0x3ff) {
      pPVar10 = (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)0x0;
      cVar13 = uVar14;
    }
    else {
      local_48 = (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)
                 new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
      MatchCharNode::MatchCharNode((MatchCharNode *)local_48,local_36);
      pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
      MatchSetNode::MatchSetNode(pMVar6,false,false);
      CharSet<char16_t>::SetRange(&pMVar6->set,this->ctAllocator,L'\xdc00',local_34);
      pPVar10 = (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)
                new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
      pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
      ConcatNode::ConcatNode(pCVar7,(Node *)pMVar6,(ConcatNode *)0x0);
      ConcatNode::ConcatNode((ConcatNode *)pPVar10,(Node *)local_48,pCVar7);
      cVar13 = uVar14 - 0x400;
    }
    pCVar7 = (ConcatNode *)pMStack_78;
    iVar16 = (int)local_50;
    if (((uVar1 == uVar14) && (pMStack_78 != (MatchSetNode *)0x0)) &&
       (pPVar10 != (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)0x0)) {
      local_48 = this;
      if (cStack_58 + -0x400 == (codepoint_t)local_70) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1e4,"(minorCodePoint != minorBoundary - 0x400u)",
                           "minorCodePoint != minorBoundary - 0x400u");
        if (!bVar4) goto LAB_00d23193;
        *puVar5 = 0;
      }
      pPVar3 = local_48;
      if (cVar13 + 0x3ff == iVar16) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1e5,"(majorBoundary + 0x3FFu != majorCodePoint)",
                           "majorBoundary + 0x3FFu != majorCodePoint");
        if (!bVar4) goto LAB_00d23193;
        *puVar5 = 0;
      }
      if (0x7ff < (uint)local_68) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1e9,"(majorCodePoint - minorCodePoint < 0x800u)",
                           "majorCodePoint - minorCodePoint < 0x800u");
        if (!bVar4) goto LAB_00d23193;
        *puVar5 = 0;
      }
      pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar3->ctAllocator,0x35916e);
      pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar3->ctAllocator,0x35916e);
      AltNode::AltNode(pAVar11,(Node *)pPVar10,(AltNode *)0x0);
    }
    else {
      local_48 = pPVar10;
      if ((uint)local_68 < 0x400) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1ef,"(majorCodePoint - minorCodePoint >= 0x400u)",
                           "majorCodePoint - minorCodePoint >= 0x400u");
        if (!bVar4) goto LAB_00d23193;
        *puVar5 = 0;
      }
      cVar15 = cStack_58;
      if (((pCVar7 == (ConcatNode *)0x0) ||
          (local_48 == (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)0x0)) &&
         ((pCVar7 != (ConcatNode *)0x0 || cStack_58 != (codepoint_t)local_70 &&
          (local_48 != (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)0x0 ||
           cVar13 + 0x3ff != iVar16)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1f2,
                           "((prefixNode != nullptr && suffixNode != nullptr) || (prefixNode == nullptr && minorBoundary == minorCodePoint) || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint))"
                           ,
                           "(prefixNode != nullptr && suffixNode != nullptr) || (prefixNode == nullptr && minorBoundary == minorCodePoint) || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint)"
                          );
        if (!bVar4) goto LAB_00d23193;
        *puVar5 = 0;
        cVar15 = cStack_58;
      }
      Js::NumberUtilities::CodePointAsSurrogatePair(cVar15,&local_3a,&local_5a);
      if (cVar13 == cVar15) {
        local_50 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        MatchCharNode::MatchCharNode((MatchCharNode *)local_50,local_3a);
      }
      else {
        Js::NumberUtilities::CodePointAsSurrogatePair(cVar13,&local_7a,&local_5a);
        pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
        MatchSetNode::MatchSetNode(pMVar6,false,false);
        local_50 = pMVar6;
        CharSet<char16_t>::SetRange(&pMVar6->set,this->ctAllocator,local_3a,local_7a);
      }
      pPVar10 = local_48;
      pAVar11 = (AltNode *)0x0;
      pMVar6 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
      MatchSetNode::MatchSetNode(pMVar6,false,false);
      local_70 = pMVar6;
      CharSet<char16_t>::SetRange(&pMVar6->set,this->ctAllocator,L'\xdc00',L'\xdfff');
      if (pPVar10 != (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)0x0) {
        pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
        AltNode::AltNode(pAVar11,(Node *)pPVar10,(AltNode *)0x0);
      }
      if (pCVar7 != (ConcatNode *)0x0) {
        pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
        AltNode::AltNode(pAVar9,&pCVar7->super_Node,pAVar11);
        pAVar11 = pAVar9;
      }
      local_68 = pAVar11;
      pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
      pCVar7 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
      pCVar8 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
      ConcatNode::ConcatNode(pCVar8,&local_70->super_Node,(ConcatNode *)0x0);
      ConcatNode::ConcatNode(pCVar7,&local_50->super_Node,pCVar8);
      pAVar11 = local_68;
    }
  }
  AltNode::AltNode(pAVar9,&pCVar7->super_Node,pAVar11);
  if (lastAltNode != (AltNode *)0x0) {
    if (lastAltNode->tail != (AltNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x219,"(lastAltNode->tail == nullptr)","lastAltNode->tail == nullptr");
      if (!bVar4) {
LAB_00d23193:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    lastAltNode->tail = pAVar9;
  }
  return pAVar9;
}

Assistant:

AltNode* Parser<P, IsLiteral>::AppendSurrogateRangeToDisjunction(codepoint_t minorCodePoint, codepoint_t majorCodePoint, AltNode *lastAltNode)
    {
        Assert(minorCodePoint < majorCodePoint);
        Assert(minorCodePoint >= 0x10000u);
        Assert(majorCodePoint >= 0x10000u);
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent);

        char16 lowerMinorCodeUnit, upperMinorCodeUnit, lowerMajorCodeUnit, upperMajorCodeUnit;
        Js::NumberUtilities::CodePointAsSurrogatePair(minorCodePoint, &lowerMinorCodeUnit, &upperMinorCodeUnit);
        Js::NumberUtilities::CodePointAsSurrogatePair(majorCodePoint, &lowerMajorCodeUnit, &upperMajorCodeUnit);

        // These boundaries represent whole range boundaries, as in 0x10000, 0x10400, 0x10800 etc
        // minor boundary is the first boundary strictly above minorCodePoint
        // major boundary is the first boundary below or equal to majorCodePoint
        codepoint_t minorBoundary = minorCodePoint - (minorCodePoint % 0x400u) + 0x400u;
        codepoint_t majorBoundary = majorCodePoint - (majorCodePoint % 0x400u);

        Assert(minorBoundary >= 0x10000);
        Assert(majorBoundary >= 0x10000);

        AltNode* tailToAdd = nullptr;

        // If the minor boundary is higher than major boundary, that means we have a range within the boundary and is less than 0x400
        // Ex: 0x10430 - 0x10700 will have minor boundary of 0x10800 and major of 0x10400
        // This pair will be represented in single range set.
        const bool singleRange = minorBoundary > majorBoundary;
        if (singleRange)
        {
            Assert(majorCodePoint - minorCodePoint < 0x400u);
            Assert(lowerMinorCodeUnit == lowerMajorCodeUnit);

            MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, lowerMinorCodeUnit);
            MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
            setNode->set.SetRange(ctAllocator, (Char)upperMinorCodeUnit, (Char)upperMajorCodeUnit);
            ConcatNode* concatNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, setNode, nullptr));

            tailToAdd = Anew(ctAllocator, AltNode, concatNode, nullptr);
        }
        else
        {
            Node* prefixNode = nullptr, *suffixNode = nullptr;
            const bool twoConsecutiveRanges = minorBoundary == majorBoundary;

            // For minorBoundary,
            if (minorBoundary - minorCodePoint == 1) // Single character in minor range
            {
                // The prefix is only a surrogate pair atom
                prefixNode = CreateSurrogatePairAtom(lowerMinorCodeUnit, upperMinorCodeUnit);
            }
            else if (minorCodePoint != minorBoundary - 0x400u) // Minor range isn't full
            {
                Assert(minorBoundary - minorCodePoint < 0x400u);
                MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, (Char)lowerMinorCodeUnit);
                MatchSetNode* upperSetNode = Anew(ctAllocator, MatchSetNode, false);
                upperSetNode->set.SetRange(ctAllocator, (Char)upperMinorCodeUnit, (Char)0xDFFFu);
                prefixNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, upperSetNode, nullptr));
            }
            else // Full minor range
            {
                minorBoundary -= 0x400u;
            }

            if (majorBoundary == majorCodePoint) // Single character in major range
            {
                // The suffix is only a surrogate pair atom
                suffixNode = CreateSurrogatePairAtom(lowerMajorCodeUnit, upperMajorCodeUnit);
                majorBoundary -= 0x400u;
            }
            else if (majorBoundary + 0x3FFu != majorCodePoint) // Major range isn't full
            {
                Assert(majorCodePoint - majorBoundary < 0x3FFu);
                MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, (Char)lowerMajorCodeUnit);
                MatchSetNode* upperSetNode = Anew(ctAllocator, MatchSetNode, false, false);
                upperSetNode->set.SetRange(ctAllocator, (Char)0xDC00u, (Char)upperMajorCodeUnit);
                suffixNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, upperSetNode, nullptr));
                majorBoundary -= 0x400u;
            }

            const bool nonFullConsecutiveRanges = twoConsecutiveRanges && prefixNode != nullptr && suffixNode != nullptr;
            if (nonFullConsecutiveRanges)
            {
                Assert(suffixNode != nullptr);
                Assert(minorCodePoint != minorBoundary - 0x400u);
                Assert(majorBoundary + 0x3FFu != majorCodePoint);

                // If the minor boundary is equal to major boundary, that means we have a cross boundary range that only needs 2 nodes for prefix/suffix.
                // We can only cross one boundary.
                Assert(majorCodePoint - minorCodePoint < 0x800u);
                tailToAdd = Anew(ctAllocator, AltNode, prefixNode, Anew(ctAllocator, AltNode, suffixNode, nullptr));
            }
            else
            {
                // We have 3 sets of ranges, comprising of prefix, full and suffix.
                Assert(majorCodePoint - minorCodePoint >= 0x400u);
                Assert((prefixNode != nullptr && suffixNode != nullptr) // Spanning more than two ranges
                    || (prefixNode == nullptr && minorBoundary == minorCodePoint) // Two consecutive ranges and the minor is full
                    || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint)); // Two consecutive ranges and the major is full

                Node* lowerOfFullRange;
                char16 lowerMinorBoundary, lowerMajorBoundary, ignore;
                Js::NumberUtilities::CodePointAsSurrogatePair(minorBoundary, &lowerMinorBoundary, &ignore);

                bool singleFullRange = majorBoundary == minorBoundary;
                if (singleFullRange)
                {
                    // The lower part of the full range is simple a surrogate lower char
                    lowerOfFullRange = Anew(ctAllocator, MatchCharNode, (Char)lowerMinorBoundary);
                }
                else
                {

                    Js::NumberUtilities::CodePointAsSurrogatePair(majorBoundary, &lowerMajorBoundary, &ignore);
                    MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    setNode->set.SetRange(ctAllocator, (Char)lowerMinorBoundary, (Char)lowerMajorBoundary);
                    lowerOfFullRange = setNode;
                }
                MatchSetNode* fullUpperRange = Anew(ctAllocator, MatchSetNode, false, false);
                fullUpperRange->set.SetRange(ctAllocator, (Char)0xDC00u, (Char)0xDFFFu);

                // These are added in the following order [full] [prefix][suffix]
                // This is doing by prepending, so in reverse.
                if (suffixNode != nullptr)
                {
                    tailToAdd = Anew(ctAllocator, AltNode, suffixNode, tailToAdd);
                }
                if (prefixNode != nullptr)
                {
                    tailToAdd = Anew(ctAllocator, AltNode, prefixNode, tailToAdd);
                }
                tailToAdd = Anew(ctAllocator, AltNode, Anew(ctAllocator, ConcatNode, lowerOfFullRange, Anew(ctAllocator, ConcatNode, fullUpperRange, nullptr)), tailToAdd);
            }
        }

        if (lastAltNode != nullptr)
        {
            Assert(lastAltNode->tail == nullptr);
            lastAltNode->tail = tailToAdd;
        }

        return tailToAdd;
    }